

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

void __thiscall cmGlobVerificationManager::Reset(cmGlobVerificationManager *this)

{
  cmGlobVerificationManager *this_local;
  
  std::
  map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
  ::clear(&this->Cache);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  return;
}

Assistant:

void cmGlobVerificationManager::Reset()
{
  this->Cache.clear();
  this->VerifyScript.clear();
  this->VerifyStamp.clear();
}